

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O2

void cft_fasttext_free(fasttext_t *handle)

{
  if (handle != (fasttext_t *)0x0) {
    fasttext::FastText::~FastText((FastText *)handle);
  }
  operator_delete(handle);
  return;
}

Assistant:

void cft_fasttext_free(fasttext_t* handle) {
    FastText* x = (FastText*)handle;
    delete x;
}